

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O2

CatalogEntry *
duckdb::Catalog::GetEntry
          (ClientContext *context,CatalogType catalog_type,string *catalog_name,string *schema_name,
          string *name)

{
  CatalogEntry *pCVar1;
  EntryLookupInfo lookup_info;
  
  EntryLookupInfo::EntryLookupInfo
            (&lookup_info,catalog_type,name,(QueryErrorContext)0xffffffffffffffff);
  pCVar1 = GetEntry(context,catalog_name,schema_name,&lookup_info);
  return pCVar1;
}

Assistant:

CatalogEntry &Catalog::GetEntry(ClientContext &context, CatalogType catalog_type, const string &catalog_name,
                                const string &schema_name, const string &name) {
	EntryLookupInfo lookup_info(catalog_type, name);
	return GetEntry(context, catalog_name, schema_name, lookup_info);
}